

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O3

int32_t icu_63::TimeZoneFormat::parseAsciiOffsetFields
                  (UnicodeString *text,ParsePosition *pos,UChar sep,OffsetFields minFields,
                  OffsetFields maxFields)

{
  short sVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char16_t *pcVar6;
  uint uVar7;
  long lVar8;
  UChar UVar9;
  uint uVar10;
  int local_50 [4];
  uint local_40 [4];
  int32_t fieldLen [3];
  int32_t fieldVal [3];
  
  uVar2 = pos->index;
  local_40[2] = 0;
  local_40[0] = 0;
  local_40[1] = 0;
  local_50[0] = 0;
  local_50[1] = -1;
  local_50[2] = -1;
  sVar1 = (text->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    uVar7 = (text->fUnion).fFields.fLength;
  }
  else {
    uVar7 = (int)sVar1 >> 5;
  }
  if (-1 < (int)maxFields && (int)uVar2 < (int)uVar7) {
    if (((int)sVar1 & 2U) == 0) {
      pcVar6 = (text->fUnion).fFields.fArray;
    }
    else {
      pcVar6 = (char16_t *)((long)&text->fUnion + 2);
    }
    iVar4 = 0;
    uVar10 = uVar2;
    lVar8 = (long)(int)uVar2;
    do {
      UVar9 = L'\xffff';
      if (uVar10 < uVar7) {
        UVar9 = pcVar6[lVar8];
      }
      if (UVar9 == sep) {
        if (iVar4 == 0) {
          iVar4 = 0;
          if (local_50[0] == 0) goto LAB_001fea90;
        }
        else {
          if (local_50[iVar4] != -1) goto LAB_001fea55;
          local_50[iVar4] = 0;
        }
      }
      else {
        iVar5 = local_50[iVar4];
        if (iVar5 == -1) goto LAB_001fea55;
        iVar3 = (ushort)UVar9 - 0x30;
        if (9 < (ushort)((ushort)UVar9 - 0x30)) {
          iVar3 = -1;
        }
        if (iVar3 < 0) goto LAB_001fea55;
        local_40[iVar4] = iVar3 + local_40[iVar4] * 10;
        local_50[iVar4] = iVar5 + 1;
        iVar4 = iVar4 + (uint)(0 < iVar5);
      }
      if (((long)(int)uVar7 <= lVar8 + 1) ||
         (uVar10 = uVar10 + 1, lVar8 = lVar8 + 1, (int)maxFields < iVar4)) goto LAB_001fea55;
    } while( true );
  }
  iVar5 = -1;
  iVar4 = 0;
  local_50[0] = 0;
LAB_001feafe:
  if (iVar5 < (int)minFields) {
    pos->errorIndex = uVar2;
    iVar4 = 0;
  }
  else {
    pos->index = local_50[0] + uVar2;
  }
  return iVar4;
LAB_001fea55:
  if (local_50[0] == 0) {
LAB_001fea90:
    iVar4 = 0;
    iVar5 = -1;
    local_50[0] = 0;
  }
  else if ((int)local_40[0] < 0x18) {
    iVar4 = local_40[0] * 3600000;
    if ((int)local_40[1] < 0x3c && local_50[1] == 2) {
      iVar4 = iVar4 + local_40[1] * 60000;
      if ((int)local_40[2] < 0x3c && local_50[2] == 2) {
        iVar4 = iVar4 + local_40[2] * 1000;
        local_50[0] = local_50[0] + 6;
        iVar5 = 2;
      }
      else {
        local_50[0] = local_50[0] + 3;
        iVar5 = 1;
      }
    }
    else {
      iVar5 = 0;
    }
  }
  else {
    iVar4 = (local_40[0] / 10) * 3600000;
    iVar5 = 0;
    local_50[0] = 1;
  }
  goto LAB_001feafe;
}

Assistant:

GMTOffsetField::GMTOffsetField()
: fText(NULL), fType(TEXT), fWidth(0) {
}